

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RngStream.cpp
# Opt level: O2

void anon_unknown.dwarf_7451::MatVecModM(double (*A) [3],double *s,double *v,double m)

{
  double s_00;
  double s_01;
  double s_02;
  double *pdVar1;
  long lVar2;
  double dVar3;
  double x [3];
  double adStack_38 [4];
  
  s_00 = *s;
  s_01 = s[1];
  s_02 = s[2];
  pdVar1 = *A + 2;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    dVar3 = MultModM((*(double (*) [3])(pdVar1 + -2))[0],s_00,0.0,m);
    dVar3 = MultModM(pdVar1[-1],s_01,dVar3,m);
    dVar3 = MultModM(*pdVar1,s_02,dVar3,m);
    adStack_38[lVar2] = dVar3;
    pdVar1 = pdVar1 + 3;
  }
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    v[lVar2] = adStack_38[lVar2];
  }
  return;
}

Assistant:

void MatVecModM (const double A[3][3], const double s[3], double v[3],
                 double m)
{
    int i;
    double x[3];               // Necessary if v = s

    for (i = 0; i < 3; ++i) {
        x[i] = MultModM (A[i][0], s[0], 0.0, m);
        x[i] = MultModM (A[i][1], s[1], x[i], m);
        x[i] = MultModM (A[i][2], s[2], x[i], m);
    }
    for (i = 0; i < 3; ++i)
        v[i] = x[i];
}